

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::RecordCustomTestMeasurements
          (cmCTestTestHandler *this,cmXMLWriter *xml,string *content)

{
  RegularExpression *this_00;
  string *__lhs;
  cmCTest *this_01;
  bool bVar1;
  unsigned_long length;
  ostream *poVar2;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var3;
  size_t sVar4;
  ulong uVar5;
  allocator<char> local_4f9;
  __array encoded_buffer;
  __array file_buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  string local_4c0;
  cmCTestTestHandler *local_4a0;
  string measurement_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  cmCTestTestMeasurementXMLParser parser;
  ostringstream ostr;
  ifstream ifs;
  
  this_00 = &this->SingleTestMeasurementRegex;
  do {
    bVar1 = cmsys::RegularExpression::find(this_00,content);
    if (!bVar1) {
      return;
    }
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&measurement_str,&this_00->regmatch,1);
    cmCTestTestMeasurementXMLParser::cmCTestTestMeasurementXMLParser(&parser);
    cmXMLParser::Parse(&parser.super_cmXMLParser,measurement_str._M_dataplus._M_p);
    __lhs = &parser.ElementName;
    bVar1 = std::operator==(__lhs,"CTestMeasurement");
    if (bVar1) {
LAB_0015f47d:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"NamedMeasurement",(allocator<char> *)&ostr);
      cmXMLWriter::StartElement(xml,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"type",&parser.MeasurementType);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&parser.MeasurementName);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ifs,"Value",(allocator<char> *)&ostr);
      cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&ifs,&parser.CharacterData);
      std::__cxx11::string::~string((string *)&ifs);
      cmXMLWriter::EndElement(xml);
    }
    else {
      bVar1 = std::operator==(__lhs,"DartMeasurement");
      if (bVar1) goto LAB_0015f47d;
      bVar1 = std::operator==(__lhs,"CTestMeasurementFile");
      if (bVar1) {
LAB_0015f56c:
        cmCTest::CleanString(&local_4c0,&parser.CharacterData,0);
        bVar1 = cmsys::SystemTools::FileExists(&local_4c0);
        if (bVar1) {
          length = cmsys::SystemTools::FileLength(&local_4c0);
          if (length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ifs,"NamedMeasurement",(allocator<char> *)&ostr);
            cmXMLWriter::StartElement(xml,(string *)&ifs);
            std::__cxx11::string::~string((string *)&ifs);
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&parser.MeasurementName);
            cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
            cmXMLWriter::Attribute<char[5]>(xml,"encoding",(char (*) [5])0x6075c1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ifs,"Value",(allocator<char> *)&local_478);
            std::operator+(&local_4e0,"Image ",&local_4c0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ostr,&local_4e0," is empty");
            cmXMLWriter::Element<std::__cxx11::string>
                      (xml,(string *)&ifs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ostr);
            std::__cxx11::string::~string((string *)&ostr);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::__cxx11::string::~string((string *)&ifs);
            cmXMLWriter::EndElement(xml);
          }
          else {
            bVar1 = std::operator==(&parser.MeasurementType,"file");
            if (bVar1) {
              AttachFile(this,xml,&local_4c0,&parser.MeasurementName);
            }
            else {
              local_4a0 = this;
              std::ifstream::ifstream((string *)&ifs,local_4c0._M_dataplus._M_p,_S_in);
              _Var3.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
              .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                   operator_new__(length + 1);
              memset((void *)_Var3.
                             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                             .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,
                     length + 1);
              file_buffer._M_t.
              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                   )(__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                     )_Var3.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              std::istream::read((char *)&ifs,
                                 (long)_Var3.
                                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
              uVar5 = (ulong)(int)((double)(long)length * 1.5 + 5.0);
              _Var3.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
              .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                   operator_new__(uVar5);
              memset((void *)_Var3.
                             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                             .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar5);
              encoded_buffer._M_t.
              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                   )(__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                     )_Var3.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              sVar4 = cmsysBase64_Encode((uchar *)file_buffer._M_t.
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl,length,
                                         (uchar *)_Var3.
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl,1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&ostr,"NamedMeasurement",(allocator<char> *)&local_4e0);
              cmXMLWriter::StartElement(xml,(string *)&ostr);
              std::__cxx11::string::~string((string *)&ostr);
              cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&parser.MeasurementName);
              cmXMLWriter::Attribute<std::__cxx11::string>(xml,"type",&parser.MeasurementType);
              cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
              uVar5 = 0;
              while( true ) {
                if (sVar4 == uVar5) break;
                std::operator<<((ostream *)&ostr,
                                *(char *)((long)encoded_buffer._M_t.
                                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                _M_head_impl + uVar5));
                if ((uVar5 != 0) && ((uVar5 / 0x3c) * 0x3c - uVar5 == 0)) {
                  std::endl<char,std::char_traits<char>>((ostream *)&ostr);
                }
                uVar5 = uVar5 + 1;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4e0,"Value",&local_4f9);
              std::__cxx11::stringbuf::str();
              this = local_4a0;
              cmXMLWriter::Element<std::__cxx11::string>(xml,&local_4e0,&local_478);
              std::__cxx11::string::~string((string *)&local_478);
              std::__cxx11::string::~string((string *)&local_4e0);
              cmXMLWriter::EndElement(xml);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        (&encoded_buffer);
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        (&file_buffer);
              std::ifstream::~ifstream((string *)&ifs);
            }
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ifs,"NamedMeasurement",(allocator<char> *)&ostr);
          cmXMLWriter::StartElement(xml,(string *)&ifs);
          std::__cxx11::string::~string((string *)&ifs);
          cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&parser.MeasurementName);
          cmXMLWriter::Attribute<char[12]>(xml,"text",(char (*) [12])"text/string");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ifs,"Value",(allocator<char> *)&local_478);
          std::operator+(&local_4e0,"File ",&local_4c0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ostr,
                         &local_4e0," not found");
          cmXMLWriter::Element<std::__cxx11::string>
                    (xml,(string *)&ifs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ostr);
          std::__cxx11::string::~string((string *)&ostr);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&ifs);
          cmXMLWriter::EndElement(xml);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar2 = std::operator<<((ostream *)&ifs,"File \"");
          poVar2 = std::operator<<(poVar2,(string *)&local_4c0);
          poVar2 = std::operator<<(poVar2,"\" not found.");
          std::endl<char,std::char_traits<char>>(poVar2);
          this_01 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(this_01,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x7ec,_ostr,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&ostr);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        }
        std::__cxx11::string::~string((string *)&local_4c0);
      }
      else {
        bVar1 = std::operator==(&parser.ElementName,"DartMeasurementFile");
        if (bVar1) goto LAB_0015f56c;
      }
    }
    cmsys::SystemTools::ReplaceString(content,measurement_str._M_dataplus._M_p,"");
    cmCTestTestMeasurementXMLParser::~cmCTestTestMeasurementXMLParser(&parser);
    std::__cxx11::string::~string((string *)&measurement_str);
  } while( true );
}

Assistant:

void cmCTestTestHandler::RecordCustomTestMeasurements(cmXMLWriter& xml,
                                                      std::string content)
{
  while (this->SingleTestMeasurementRegex.find(content)) {
    // Extract regex match from content and parse it as an XML element.
    auto measurement_str = this->SingleTestMeasurementRegex.match(1);
    auto parser = cmCTestTestMeasurementXMLParser();
    parser.Parse(measurement_str.c_str());

    if (parser.ElementName == "CTestMeasurement" ||
        parser.ElementName == "DartMeasurement") {
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", parser.MeasurementType);
      xml.Attribute("name", parser.MeasurementName);
      xml.Element("Value", parser.CharacterData);
      xml.EndElement();
    } else if (parser.ElementName == "CTestMeasurementFile" ||
               parser.ElementName == "DartMeasurementFile") {
      const std::string& filename = cmCTest::CleanString(parser.CharacterData);
      if (!cmSystemTools::FileExists(filename)) {
        xml.StartElement("NamedMeasurement");
        xml.Attribute("name", parser.MeasurementName);
        xml.Attribute("text", "text/string");
        xml.Element("Value", "File " + filename + " not found");
        xml.EndElement();
        cmCTestOptionalLog(
          this->CTest, HANDLER_OUTPUT,
          "File \"" << filename << "\" not found." << std::endl, this->Quiet);
      } else {
        long len = cmSystemTools::FileLength(filename);
        if (len == 0) {
          xml.StartElement("NamedMeasurement");
          xml.Attribute("name", parser.MeasurementName);
          xml.Attribute("type", "text/string");
          xml.Attribute("encoding", "none");
          xml.Element("Value", "Image " + filename + " is empty");
          xml.EndElement();
        } else {
          if (parser.MeasurementType == "file") {
            // Treat this measurement like an "ATTACHED_FILE" when the type
            // is explicitly "file" (not an image).
            this->AttachFile(xml, filename, parser.MeasurementName);
          } else {
            cmsys::ifstream ifs(filename.c_str(),
                                std::ios::in
#ifdef _WIN32
                                  | std::ios::binary
#endif
            );
            auto file_buffer = cm::make_unique<unsigned char[]>(len + 1);
            ifs.read(reinterpret_cast<char*>(file_buffer.get()), len);
            auto encoded_buffer = cm::make_unique<unsigned char[]>(
              static_cast<int>(static_cast<double>(len) * 1.5 + 5.0));

            size_t rlen = cmsysBase64_Encode(file_buffer.get(), len,
                                             encoded_buffer.get(), 1);

            xml.StartElement("NamedMeasurement");
            xml.Attribute("name", parser.MeasurementName);
            xml.Attribute("type", parser.MeasurementType);
            xml.Attribute("encoding", "base64");
            std::ostringstream ostr;
            for (size_t cc = 0; cc < rlen; cc++) {
              ostr << encoded_buffer[cc];
              if (cc % 60 == 0 && cc) {
                ostr << std::endl;
              }
            }
            xml.Element("Value", ostr.str());
            xml.EndElement(); // NamedMeasurement
          }
        }
      }
    }

    // Remove this element from content.
    cmSystemTools::ReplaceString(content, measurement_str.c_str(), "");
  }
}